

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

SchemaElementDecl * __thiscall
xercesc_4_0::TraverseSchema::processElementDeclRef
          (TraverseSchema *this,DOMElement *elem,XMLCh *refName)

{
  XSAnnotation *pXVar1;
  ComplexTypeInfo *pCVar2;
  ulong uVar3;
  SchemaElementDecl **ppSVar4;
  MemoryManager *pMVar5;
  BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *pBVar6;
  XMLSize_t XVar7;
  int iVar8;
  XMLSize_t index;
  DOMElement *pDVar9;
  SchemaElementDecl *pSVar10;
  RefVectorOf<xercesc_4_0::SchemaElementDecl> *pRVar11;
  undefined4 extraout_var;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,elem,0x11,this,false,this->fNonXSAttList);
  pDVar9 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  pDVar9 = checkContent(this,elem,pDVar9,true,true);
  pXVar1 = this->fAnnotation;
  if (pDVar9 != (DOMElement *)0x0) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLValidity",0x1f,L"element",
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  pSVar10 = getGlobalElemDecl(this,elem,refName);
  if (pSVar10 == (SchemaElementDecl *)0x0) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x27,refName,
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    goto LAB_00337896;
  }
  pCVar2 = this->fCurrentComplexType;
  if (pCVar2 != (ComplexTypeInfo *)0x0) {
    pRVar11 = pCVar2->fElements;
    if (pRVar11 == (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) {
      pRVar11 = (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)
                XMemory::operator_new(0x30,pCVar2->fMemoryManager);
      pMVar5 = pCVar2->fMemoryManager;
      (pRVar11->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>)._vptr_BaseRefVectorOf =
           (_func_int **)&PTR__BaseRefVectorOf_00416108;
      (pRVar11->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fAdoptedElems = false;
      (pRVar11->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fCurCount = 0;
      (pRVar11->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fMaxCount = 8;
      (pRVar11->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList =
           (SchemaElementDecl **)0x0;
      (pRVar11->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fMemoryManager = pMVar5;
      iVar8 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,0x40);
      (pRVar11->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList =
           (SchemaElementDecl **)CONCAT44(extraout_var,iVar8);
      lVar12 = 0;
      do {
        (pRVar11->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList[lVar12] =
             (SchemaElementDecl *)0x0;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 8);
      (pRVar11->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>)._vptr_BaseRefVectorOf =
           (_func_int **)&PTR__RefVectorOf_00416090;
      pCVar2->fElements = pRVar11;
    }
    else {
      uVar3 = (pRVar11->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fCurCount;
      bVar15 = uVar3 != 0;
      if (bVar15) {
        ppSVar4 = (pRVar11->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList;
        if (*ppSVar4 == pSVar10) goto LAB_00337829;
        uVar13 = 0;
        do {
          uVar14 = uVar3;
          if (uVar3 - 1 == uVar13) break;
          uVar14 = uVar13 + 1;
          lVar12 = uVar13 + 1;
          uVar13 = uVar14;
        } while (ppSVar4[lVar12] != pSVar10);
        bVar15 = uVar14 < uVar3;
      }
      if (bVar15) goto LAB_00337829;
    }
    pBVar6 = &pCVar2->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>;
    BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::ensureExtraCapacity(pBVar6,1);
    XVar7 = pBVar6->fCurCount;
    pBVar6->fElemList[XVar7] = pSVar10;
    pBVar6->fCurCount = XVar7 + 1;
  }
LAB_00337829:
  if (this->fCurrentGroupInfo != (XercesGroupInfo *)0x0) {
    pBVar6 = &this->fCurrentGroupInfo->fElements->
              super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>;
    uVar3 = pBVar6->fCurCount;
    bVar15 = uVar3 != 0;
    if (bVar15) {
      if (*pBVar6->fElemList == pSVar10) goto LAB_00337896;
      uVar13 = 0;
      do {
        uVar14 = uVar3;
        if (uVar3 - 1 == uVar13) break;
        uVar14 = uVar13 + 1;
        lVar12 = uVar13 + 1;
        uVar13 = uVar14;
      } while (pBVar6->fElemList[lVar12] != pSVar10);
      bVar15 = uVar14 < uVar3;
    }
    if (!bVar15) {
      BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::ensureExtraCapacity(pBVar6,1);
      XVar7 = pBVar6->fCurCount;
      pBVar6->fElemList[XVar7] = pSVar10;
      pBVar6->fCurCount = XVar7 + 1;
    }
  }
LAB_00337896:
  if (pXVar1 != (XSAnnotation *)0x0) {
    (*(pXVar1->super_XSerializable)._vptr_XSerializable[1])(pXVar1);
  }
  return pSVar10;
}

Assistant:

SchemaElementDecl*
TraverseSchema::processElementDeclRef(const DOMElement* const elem,
                                      const XMLCh* const refName)
{
    // check attributes
    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_ElementRef, this, false, fNonXSAttList
    );

    // handle annotation
    DOMElement* content = checkContent(elem, XUtil::getFirstChildElement(elem), true);
    Janitor<XSAnnotation> janAnnot(fAnnotation);

    // do not generate synthetic annotation for element reference...

    if (content != 0)
        reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::NoContentForRef, SchemaSymbols::fgELT_ELEMENT);

    SchemaElementDecl* refElemDecl = getGlobalElemDecl(elem, refName);

    if (!refElemDecl)
    {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::RefElementNotFound, refName);
    }
    else
    {
        if (fCurrentComplexType)
            fCurrentComplexType->addElement(refElemDecl);

        if (fCurrentGroupInfo)
            fCurrentGroupInfo->addElement(refElemDecl);
    }

    return refElemDecl;
}